

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test>
             *this)

{
  _Tuple_impl<0UL,_int,_int> _Var1;
  GTestFlagSaver *pGVar2;
  _func_int **pp_Var3;
  GTestFlagSaver *pGVar4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  Test *this_00;
  ParamType *pPVar7;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,(anonymous_namespace)::TestVideoParam,std::tuple<int,int>>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x448);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_01088018;
  this_00[1]._vptr_Test = (_func_int **)&PTR__TestWithParam_01088058;
  pPVar7 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
           ::GetParam();
  this_00[2]._vptr_Test =
       (_func_int **)
       (pPVar7->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
       ).super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl;
  *(undefined1 *)
   &this_00[2].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0;
  this_00[0x3c]._vptr_Test = (_func_int **)(this_00 + 0x3d);
  this_00[0x3c].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined1 *)&this_00[0x3d]._vptr_Test = 0;
  this_00[0x3e]._vptr_Test = (_func_int **)0x0;
  this_00[0x3e].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined4 *)&this_00[0x3f]._vptr_Test = 0;
  *(undefined4 *)((long)&this_00[3]._vptr_Test + 4) = 1;
  this_00->_vptr_Test = (_func_int **)&PTR__HorzSuperresQThreshEndToEndTest_01088440;
  this_00[1]._vptr_Test = (_func_int **)&PTR__HorzSuperresQThreshEndToEndTest_01088498;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__HorzSuperresQThreshEndToEndTest_010884b8;
  pPVar7 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
           ::GetParam();
  pGVar2 = (GTestFlagSaver *)
           (pPVar7->
           super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
           ).super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>.
           super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict._M_head_impl
           .filename;
  pp_Var3 = *(_func_int ***)
             &(pPVar7->
              super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
              ).super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
              .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict.
              _M_head_impl.fmt;
  pGVar4 = *(GTestFlagSaver **)
            &(pPVar7->
             super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
             ).super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>.
             super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict.
             _M_head_impl.profile;
  pp_Var5 = *(_func_int ***)
             &(pPVar7->
              super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
              ).super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
              .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict.
              _M_head_impl.screen_content;
  pp_Var6 = (_func_int **)
            (pPVar7->
            super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
            ).super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>.
            super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict.
            _M_head_impl.psnr_threshold2;
  this_00[0x41].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)
       (pPVar7->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
       ).super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>.
       super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict._M_head_impl.
       psnr_threshold;
  this_00[0x42]._vptr_Test = pp_Var6;
  this_00[0x40].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = pGVar4;
  this_00[0x41]._vptr_Test = pp_Var5;
  this_00[0x3f].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = pGVar2;
  this_00[0x40]._vptr_Test = pp_Var3;
  *(undefined4 *)
   &this_00[0x42].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 3;
  this_00[0x43].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined4 *)&this_00[0x44]._vptr_Test = 0;
  pPVar7 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
           ::GetParam();
  _Var1 = (pPVar7->
          super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
          ).super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>.
          super__Tuple_impl<2UL,_std::tuple<int,_int>_>.
          super__Head_base<2UL,_std::tuple<int,_int>,_false>._M_head_impl.
          super__Tuple_impl<0UL,_int,_int>;
  *(ulong *)((long)&this_00[0x42].gtest_flag_saver_._M_t.
                    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl
            + 4) = (ulong)_Var1 >> 0x20 | (long)_Var1 << 0x20;
  this_00->_vptr_Test = (_func_int **)&PTR__HorzSuperresQThreshEndToEndTest_010882d0;
  this_00[1]._vptr_Test =
       (_func_int **)
       &PTR__HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test_01088328;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)
       &PTR__HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test_01088348;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }